

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

NodeIt __thiscall trieste::NodeDef::erase(NodeDef *this,NodeIt first,NodeIt last)

{
  element_type *peVar1;
  NodeIt it;
  NodeIt NVar2;
  iterator iVar3;
  
  for (NVar2._M_current = first._M_current; NVar2._M_current != last._M_current;
      NVar2._M_current = NVar2._M_current + 1) {
    peVar1 = ((NVar2._M_current)->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (peVar1->parent_ == this) {
      peVar1->parent_ = (NodeDef *)0x0;
    }
  }
  iVar3 = CLI::std::
          vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ::erase(&this->children,(const_iterator)first._M_current,(const_iterator)last._M_current);
  return (NodeIt)iVar3._M_current;
}

Assistant:

NodeIt erase(NodeIt first, NodeIt last)
    {
      for (auto it = first; it != last; ++it)
      {
        // Only clear the parent if the node is not shared.
        if ((*it)->parent_ == this)
          (*it)->parent_ = nullptr;
      }

      return children.erase(first, last);
    }